

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_mod_uvec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  int i_2;
  float local_68 [4];
  undefined8 local_58;
  float local_50;
  float local_4c;
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> res_2;
  Vector<float,_4> res_3;
  
  local_58 = *(undefined8 *)(c->in[0].m_data + 1);
  local_50 = c->in[0].m_data[3];
  local_4c = c->in[0].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (uint)(long)*(float *)((long)&local_58 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_68[0] = c->in[1].m_data[3];
  local_68[1] = c->in[1].m_data[2];
  local_68[2] = c->in[1].m_data[1];
  local_68[3] = c->in[1].m_data[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = (uint)(long)local_68[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_2.m_data[0] = 0;
  res_2.m_data[1] = 0;
  res_2.m_data[2] = 0;
  res_2.m_data[3] = 0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = res.m_data[lVar1] % res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    res_3.m_data[lVar1] = (float)res_2.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = res_3.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_3.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }